

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::ZeroDelayObserver::setInput(ZeroDelayObserver *this,InputVector *u_k,TimeIndex k)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  TimeSize TVar4;
  TimeIndex TVar5;
  TimeIndex k_local;
  InputVector *u_k_local;
  ZeroDelayObserver *this_local;
  
  if ((this->super_ObserverBase).p_ < 1) {
    return;
  }
  uVar3 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1c])(this,u_k);
  if ((uVar3 & 1) == 0) {
    __assert_fail("checkInputVector(u_k) && \"The size of the input vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x5a,
                  "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
                 );
  }
  TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(&this->u_);
  if (TVar4 < 1) {
    bVar2 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::isSet(&this->x_);
    if ((bVar2) &&
       (TVar5 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_),
       TVar5 != k)) {
      TVar5 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
      bVar2 = false;
      if (TVar5 == k + -1) goto LAB_0019e760;
    }
    else {
LAB_0019e760:
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("(!x_.isSet() || x_.getTime() == k || x_.getTime() == k - 1) && \"ERROR: The time is set incorrectly for the                           inputs (must be [current_time] or [current_time+1])\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                    ,99,
                    "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
                   );
    }
    goto LAB_0019e793;
  }
  TVar5 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::getNextIndex(&this->u_);
  if (TVar5 == k) {
LAB_0019e6e5:
    bVar2 = true;
  }
  else {
    bVar1 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::checkIndex(&this->u_,k);
    bVar2 = false;
    if (bVar1) goto LAB_0019e6e5;
  }
  if (!bVar2) {
    __assert_fail("(u_.getNextIndex() == k || u_.checkIndex(k)) && \"ERROR: The time is set incorrectly                                 for the inputs (order or gap)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x5e,
                  "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
                 );
  }
LAB_0019e793:
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::setValue(&this->u_,u_k,k);
  return;
}

Assistant:

void ZeroDelayObserver::setInput(const ObserverBase::InputVector & u_k, TimeIndex k)
{
  if(p_ > 0)
  {
    BOOST_ASSERT(checkInputVector(u_k) && "The size of the input vector is incorrect");

    if(u_.size() > 0)
      BOOST_ASSERT((u_.getNextIndex() == k || u_.checkIndex(k)) && "ERROR: The time is set incorrectly \
                                for the inputs (order or gap)");
    else
    {
      BOOST_ASSERT((!x_.isSet() || x_.getTime() == k || x_.getTime() == k - 1)
                   && "ERROR: The time is set incorrectly for the \
                          inputs (must be [current_time] or [current_time+1])");
    }

    u_.setValue(u_k, k);
  }
}